

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

string * __thiscall
t_netstd_generator::make_valid_csharp_identifier
          (string *__return_storage_ptr__,t_netstd_generator *this,string *fromName)

{
  ulong uVar1;
  char *pcVar2;
  ulong local_68;
  size_t i;
  char local_29;
  char c;
  string *local_20;
  string *fromName_local;
  t_netstd_generator *this_local;
  string *str;
  
  c = '\0';
  local_20 = fromName;
  fromName_local = (string *)this;
  this_local = (t_netstd_generator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fromName);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::at((ulong)__return_storage_ptr__);
    local_29 = *pcVar2;
    if (('/' < local_29) && (local_29 < ':')) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,"_",
                     __return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
    }
    for (local_68 = 0; uVar1 = std::__cxx11::string::size(), local_68 < uVar1;
        local_68 = local_68 + 1) {
      pcVar2 = (char *)std::__cxx11::string::at((ulong)__return_storage_ptr__);
      local_29 = *pcVar2;
      if ((((local_29 < 'A') || ('Z' < local_29)) && ((local_29 < 'a' || ('z' < local_29)))) &&
         (((local_29 < '0' || ('9' < local_29)) && (local_29 != '_')))) {
        std::__cxx11::string::replace((ulong)__return_storage_ptr__,local_68,(char *)0x1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::make_valid_csharp_identifier(string const& fromName)
{
    string str = fromName;
    if (str.empty())
    {
        return str;
    }

    // tests rely on this
    assert(('A' < 'Z') && ('a' < 'z') && ('0' < '9'));

    // if the first letter is a number, we add an additional underscore in front of it
    char c = str.at(0);
    if (('0' <= c) && (c <= '9'))
    {
        str = "_" + str;
    }

    // following chars: letter, number or underscore
    for (size_t i = 0; i < str.size(); ++i)
    {
        c = str.at(i);
        if (('A' > c || c > 'Z') && ('a' > c || c > 'z') && ('0' > c || c > '9') && '_' != c)
        {
            str.replace(i, 1, "_");
        }
    }

    return str;
}